

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O3

QCollatorSortKey QCollator::defaultSortKey(QStringView key)

{
  GenerationalCollator *this;
  Type *this_00;
  void **ppvVar1;
  QCollator *this_01;
  QChar *in_RDX;
  QExplicitlySharedDataPointer<QCollatorSortKeyPrivate> this_02;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  this_02.d.ptr = (totally_ordered_wrapper<QCollatorSortKeyPrivate_*>)key.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>::
            operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>
                        *)this_02.d.ptr);
  ppvVar1 = QThreadStorageData::get(&this_00->d);
  if (ppvVar1 == (void **)0x0) {
    this_01 = (QCollator *)operator_new(0x10);
    this_01->d = (QCollatorPrivate *)0x0;
    this_01[1].d = (QCollatorPrivate *)0x0;
    QCollator(this_01);
    *(Type *)&this_01[1].d = QLocalePrivate::s_generation._q_value.super___atomic_base<int>._M_i;
    ppvVar1 = QThreadStorageData::set(&this_00->d,this_01);
  }
  this = (GenerationalCollator *)*ppvVar1;
  anon_unknown.dwarf_be581e::GenerationalCollator::collator(this);
  QString::QString(&local_48,in_RDX,(qsizetype)key.m_data);
  sortKey((QCollator *)this_02.d.ptr,(QString *)this);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QExplicitlySharedDataPointer<QCollatorSortKeyPrivate>)
           (QExplicitlySharedDataPointer<QCollatorSortKeyPrivate>)this_02.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QCollatorSortKey QCollator::defaultSortKey(QStringView key)
{
    return defaultCollator->localData().collator().sortKey(key.toString());
}